

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool __thiscall cs::codecvt::gbk::is_identifier(gbk *this,char32_t ch)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = compiler_type::issignal(L'\0');
  if (bVar1) {
    bVar1 = false;
  }
  else if ((short)ch < 0) {
    bVar1 = ch == L'ꦖ' ||
            ((uint)(ch + L'\xffff55c0') < 0x5461 || (uint)(ch + L'\xffff7ec0') < 0x1fbf);
  }
  else {
    bVar1 = true;
    if (ch != L'_') {
      iVar2 = iswalnum(ch);
      bVar1 = iVar2 != 0;
    }
  }
  return bVar1;
}

Assistant:

bool is_identifier(char32_t ch) override
			{
				if (compiler_type::issignal(ch))
					return false;
				/**
				 * Chinese Character in GBK Charset
				 * GBK/2: 0xB0A1 - 0xF7FE
				 * GBK/3: 0x8140 - 0xA0FE
				 * GBK/4: 0xAA40 - 0xFEA0
				 * GBK/5: 0xA996
				 */
				if (ch & u32_blck_begin)
					return (ch >= 0xB0A1 && ch <= 0xF7FE) || (ch >= 0x8140 && ch <= 0xA0FE) ||
					       (ch >= 0xAA40 && ch <= 0xFEA0) || ch == 0xA996;
				else
					return ch == '_' || std::iswalnum(ch);
			}